

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call_graph.hpp
# Opt level: O0

void __thiscall
HawkTracer::client::CallGraph::TreeNode::TreeNode(TreeNode *this,NodeData *node_data)

{
  HT_DurationNs HVar1;
  NodeData *node_data_local;
  TreeNode *this_local;
  
  NodeData::NodeData(&this->data);
  std::
  vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
  ::vector(&this->children);
  std::weak_ptr<HawkTracer::client::CallGraph::TreeNode>::weak_ptr(&this->parent);
  NodeData::operator=(&this->data,node_data);
  HVar1 = NodeData::get_duration(node_data);
  this->total_duration = HVar1;
  this->total_children_duration = 0;
  return;
}

Assistant:

TreeNode(NodeData node_data)
        {
            data = node_data;
            total_duration = node_data.get_duration();
            total_children_duration = 0u;
        }